

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImVector<ImGuiContextHook> *this;
  ImS8 *pIVar1;
  ImVec2 *pIVar2;
  ImU16 *pIVar3;
  float fVar4;
  double dVar5;
  ImU16 IVar6;
  uint uVar7;
  ImGuiNavLayer IVar8;
  ImGuiContextHook *pIVar9;
  char *pcVar10;
  ImGuiViewportP *pIVar11;
  ImGuiTableTempData *pIVar12;
  ImGuiStackLevelInfo *pIVar13;
  undefined1 auVar14 [12];
  ImGuiScrollFlags scroll_flags;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  ImGuiNavDirSourceFlags dir_sources;
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  ImGuiContext *ctx;
  ImGuiContext *pIVar19;
  undefined3 uVar20;
  char cVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  int n_2;
  ImGuiID IVar26;
  ImGuiKeyModFlags IVar27;
  ImGuiInputSource IVar28;
  ImGuiNavLayer layer;
  ImGuiDir IVar29;
  ImGuiDir IVar30;
  ImFont *font;
  ImGuiWindow *pIVar31;
  ImGuiContext *pIVar32;
  undefined7 extraout_var;
  float *pfVar33;
  int i;
  int iVar34;
  ImGuiID IVar35;
  ImGuiWindow *pIVar36;
  ImGuiWindow *window;
  int n_3;
  long lVar37;
  ulong uVar38;
  ImGuiContext *g_2;
  float *pfVar39;
  ulong uVar40;
  float *pfVar41;
  bool *pbVar42;
  ImGuiContext *g;
  long lVar43;
  ImGuiContext *pIVar44;
  ImGuiWindow *old_nav_window;
  byte bVar45;
  uint uVar46;
  uint uVar47;
  ImVec2 IVar49;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  ImVec2 IVar50;
  float fVar48;
  ImVec2 IVar51;
  undefined1 auVar52 [12];
  float fVar53;
  ImVec2 IVar54;
  undefined1 auVar55 [16];
  float fVar58;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  ImRect IVar62;
  undefined1 local_b8 [16];
  uint local_98;
  undefined1 local_88 [8];
  ImVec2 IStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  ulong local_58;
  int iStack_50;
  int iStack_4c;
  ImRect local_48;
  
  ctx = GImGui;
  bVar45 = 0;
  this = &GImGui->Hooks;
  uVar38 = (ulong)(uint)(GImGui->Hooks).Size;
  lVar43 = uVar38 << 5;
  while( true ) {
    if ((int)uVar38 < 1) break;
    pIVar9 = (ctx->Hooks).Data;
    if (*(int *)(pIVar9 + lVar43 + -0x1c) == 7) {
      ImVector<ImGuiContextHook>::erase(this,pIVar9 + lVar43 + -0x20);
    }
    uVar38 = (ulong)((int)uVar38 - 1);
    lVar43 = lVar43 + -0x20;
  }
  CallContextHooks(ctx,ImGuiContextHookType_NewFramePre);
  pIVar44 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar44->SettingsLoaded == false) {
    pcVar10 = (pIVar44->IO).IniFilename;
    if (pcVar10 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar10);
    }
    pIVar44->SettingsLoaded = true;
  }
  if ((0.0 < pIVar44->SettingsDirtyTimer) &&
     (IVar50.x = pIVar44->SettingsDirtyTimer - (pIVar44->IO).DeltaTime,
     pIVar44->SettingsDirtyTimer = IVar50.x, IVar50.x <= 0.0)) {
    pcVar10 = (pIVar44->IO).IniFilename;
    if (pcVar10 == (char *)0x0) {
      (pIVar44->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar10);
    }
    pIVar44->SettingsDirtyTimer = 0.0;
  }
  ctx->Time = (double)(ctx->IO).DeltaTime + ctx->Time;
  ctx->WithinFrameScope = true;
  ctx->FrameCount = ctx->FrameCount + 1;
  ctx->TooltipOverrideCount = 0;
  ctx->WindowsActiveCount = 0;
  lVar43 = 0;
  ImVector<unsigned_int>::resize(&ctx->MenusIdSubmittedThisFrame,0);
  IVar50.x = (ctx->IO).DeltaTime;
  iVar34 = ctx->FramerateSecPerFrameIdx;
  ctx->FramerateSecPerFrameAccum =
       (IVar50.x - ctx->FramerateSecPerFrame[iVar34]) + ctx->FramerateSecPerFrameAccum;
  ctx->FramerateSecPerFrame[iVar34] = IVar50.x;
  ctx->FramerateSecPerFrameIdx = (iVar34 + 1) % 0x78;
  iVar34 = 0x77;
  if (ctx->FramerateSecPerFrameCount < 0x77) {
    iVar34 = ctx->FramerateSecPerFrameCount;
  }
  ctx->FramerateSecPerFrameCount = iVar34 + 1;
  uVar46 = -(uint)(0.0 < ctx->FramerateSecPerFrameAccum);
  (ctx->IO).Framerate =
       (float)(~uVar46 & 0x7f7fffff |
              (uint)(1.0 / (ctx->FramerateSecPerFrameAccum / (float)(iVar34 + 1))) & uVar46);
  pIVar44 = GImGui;
  pIVar11 = *(GImGui->Viewports).Data;
  (pIVar11->super_ImGuiViewport).Flags = 5;
  (pIVar11->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar11->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar11->super_ImGuiViewport).Size = (pIVar44->IO).DisplaySize;
  for (; lVar43 < (pIVar44->Viewports).Size; lVar43 = lVar43 + 1) {
    pIVar11 = (pIVar44->Viewports).Data[lVar43];
    pIVar11->WorkOffsetMin = pIVar11->BuildWorkOffsetMin;
    pIVar11->WorkOffsetMax = pIVar11->BuildWorkOffsetMax;
    (pIVar11->BuildWorkOffsetMin).x = 0.0;
    (pIVar11->BuildWorkOffsetMin).y = 0.0;
    (pIVar11->BuildWorkOffsetMax).x = 0.0;
    (pIVar11->BuildWorkOffsetMax).y = 0.0;
    ImGuiViewportP::UpdateWorkRect(pIVar11);
  }
  ((ctx->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  IVar50.x = 3.4028235e+38;
  fVar53 = 3.4028235e+38;
  fVar58 = -3.4028235e+38;
  fVar48 = -3.4028235e+38;
  for (lVar43 = 0; lVar43 < (ctx->Viewports).Size; lVar43 = lVar43 + 1) {
    IVar62 = ImGuiViewportP::GetMainRect((ctx->Viewports).Data[lVar43]);
    fVar61 = IVar62.Min.x;
    if (IVar50.x <= IVar62.Min.x) {
      fVar61 = IVar50.x;
    }
    IVar50.x = IVar62.Min.y;
    if (fVar53 <= IVar62.Min.y) {
      IVar50.x = fVar53;
    }
    if (fVar58 < IVar62.Max.x) {
      auVar52._4_4_ = IVar50.x;
      auVar52._0_4_ = fVar61;
      auVar52._8_4_ = IVar62.Max.x;
    }
    else {
      auVar52._4_4_ = IVar50.x;
      auVar52._0_4_ = fVar61;
      auVar52._8_4_ = fVar58;
    }
    IVar50.x = auVar52._0_4_;
    fVar53 = auVar52._4_4_;
    fVar58 = auVar52._8_4_;
    if (fVar48 < IVar62.Max.y) {
      fVar48 = IVar62.Max.y;
    }
  }
  (ctx->DrawListSharedData).ClipRectFullscreen.x = IVar50.x;
  (ctx->DrawListSharedData).ClipRectFullscreen.y = fVar53;
  (ctx->DrawListSharedData).ClipRectFullscreen.z = fVar58;
  (ctx->DrawListSharedData).ClipRectFullscreen.w = fVar48;
  IVar50.x = (ctx->Style).CircleTessellationMaxError;
  (ctx->DrawListSharedData).CurveTessellationTol = (ctx->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&ctx->DrawListSharedData,IVar50.x);
  bVar22 = (ctx->Style).AntiAliasedLines;
  uVar46 = (uint)bVar22;
  (ctx->DrawListSharedData).InitialFlags = (uint)bVar22;
  if (((ctx->Style).AntiAliasedLinesUseTex != false) &&
     ((ctx->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar46 = bVar22 | 2;
    (ctx->DrawListSharedData).InitialFlags = uVar46;
  }
  if ((ctx->Style).AntiAliasedFill == true) {
    uVar46 = uVar46 | 4;
    (ctx->DrawListSharedData).InitialFlags = uVar46;
  }
  if (((ctx->IO).BackendFlags & 8) != 0) {
    (ctx->DrawListSharedData).InitialFlags = uVar46 | 8;
  }
  for (lVar43 = 0; lVar43 < (ctx->Viewports).Size; lVar43 = lVar43 + 1) {
    pIVar11 = (ctx->Viewports).Data[lVar43];
    (pIVar11->DrawDataP).DisplaySize.x = 0.0;
    (pIVar11->DrawDataP).DisplaySize.y = 0.0;
    (pIVar11->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar11->DrawDataP).FramebufferScale.y = 0.0;
    (pIVar11->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar11->DrawDataP).DisplayPos.x = 0.0;
    (pIVar11->DrawDataP).DisplayPos.y = 0.0;
    (pIVar11->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar11->DrawDataP).field_0x1 = 0;
    (pIVar11->DrawDataP).CmdListsCount = 0;
    (pIVar11->DrawDataP).TotalIdxCount = 0;
    (pIVar11->DrawDataP).TotalVtxCount = 0;
  }
  if ((ctx->DragDropActive != false) &&
     (IVar35 = (ctx->DragDropPayload).SourceId, IVar35 == ctx->ActiveId)) {
    KeepAliveID(IVar35);
  }
  if (ctx->HoveredIdPreviousFrame == 0) {
    IVar35 = ctx->HoveredId;
    ctx->HoveredIdTimer = 0.0;
    ctx->HoveredIdNotActiveTimer = 0.0;
    if (IVar35 == 0) goto LAB_0010e041;
LAB_0010e01a:
    IVar50.x = (ctx->IO).DeltaTime;
    ctx->HoveredIdTimer = ctx->HoveredIdTimer + IVar50.x;
    IVar26 = IVar35;
    if (ctx->ActiveId != IVar35) {
      ctx->HoveredIdNotActiveTimer = IVar50.x + ctx->HoveredIdNotActiveTimer;
      IVar26 = ctx->ActiveId;
    }
  }
  else {
    IVar35 = ctx->HoveredId;
    if (IVar35 != 0) {
      if (ctx->ActiveId == IVar35) {
        ctx->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0010e01a;
    }
LAB_0010e041:
    IVar35 = 0;
    IVar26 = ctx->ActiveId;
  }
  ctx->HoveredIdPreviousFrame = IVar35;
  ctx->HoveredIdPreviousFrameUsingMouseWheel = ctx->HoveredIdUsingMouseWheel;
  ctx->HoveredId = 0;
  ctx->HoveredIdAllowOverlap = false;
  ctx->HoveredIdUsingMouseWheel = false;
  ctx->HoveredIdDisabled = false;
  if (((ctx->ActiveIdIsAlive != IVar26) && (IVar26 != 0)) && (ctx->ActiveIdPreviousFrame == IVar26))
  {
    ClearActiveID();
    IVar26 = ctx->ActiveId;
  }
  IVar50.x = (ctx->IO).DeltaTime;
  if (IVar26 != 0) {
    ctx->ActiveIdTimer = ctx->ActiveIdTimer + IVar50.x;
  }
  ctx->LastActiveIdTimer = IVar50.x + ctx->LastActiveIdTimer;
  ctx->ActiveIdPreviousFrame = IVar26;
  ctx->ActiveIdPreviousFrameWindow = ctx->ActiveIdWindow;
  ctx->ActiveIdPreviousFrameHasBeenEditedBefore = ctx->ActiveIdHasBeenEditedBefore;
  ctx->ActiveIdIsAlive = 0;
  ctx->ActiveIdHasBeenEditedThisFrame = false;
  ctx->ActiveIdPreviousFrameIsAlive = false;
  ctx->ActiveIdIsJustActivated = false;
  if (ctx->TempInputId == 0) {
LAB_0010e11f:
    if (IVar26 == 0) {
      (ctx->ActiveIdUsingKeyInputMask).Storage[1] = 0;
      (ctx->ActiveIdUsingKeyInputMask).Storage[2] = 0;
      (ctx->ActiveIdUsingKeyInputMask).Storage[3] = 0;
      (ctx->ActiveIdUsingKeyInputMask).Storage[4] = 0;
      ctx->ActiveIdUsingNavDirMask = 0;
      ctx->ActiveIdUsingNavInputMask = 0;
      (ctx->ActiveIdUsingKeyInputMask).Storage[0] = 0;
      (ctx->ActiveIdUsingKeyInputMask).Storage[1] = 0;
    }
  }
  else if (IVar26 != ctx->TempInputId) {
    ctx->TempInputId = 0;
    goto LAB_0010e11f;
  }
  ctx->DragDropAcceptIdPrev = ctx->DragDropAcceptIdCurr;
  ctx->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  ctx->DragDropAcceptIdCurr = 0;
  ctx->DragDropWithinSource = false;
  ctx->DragDropWithinTarget = false;
  ctx->DragDropHoldJustPressedId = 0;
  ImVector<ImGuiInputEvent>::resize(&ctx->InputEventsTrail,0);
  UpdateInputEvents((ctx->IO).ConfigInputTrickleEventQueue);
  pIVar44 = GImGui;
  cVar21 = (GImGui->IO).BackendUsingLegacyKeyArrays;
  if (cVar21 != '\0') {
    for (lVar43 = 0; lVar43 != 0x85; lVar43 = lVar43 + 1) {
      lVar37 = (long)(pIVar44->IO).KeyMap[lVar43 + 0x200];
      if (lVar37 != -1) {
        (pIVar44->IO).KeyMap[lVar37] = (int)lVar43 + 0x200;
      }
    }
    for (uVar38 = 0; uVar38 != 0x200; uVar38 = uVar38 + 1) {
      bVar22 = (pIVar44->IO).KeysDown[uVar38];
      if ((cVar21 == '\x01' | bVar22) == 1) {
        uVar46 = (pIVar44->IO).KeyMap[uVar38];
        uVar40 = uVar38 & 0xffffffff;
        if (uVar46 != 0xffffffff) {
          uVar40 = (ulong)uVar46;
        }
        (pIVar44->IO).KeysData[(int)uVar40].Down = bVar22;
        if (uVar38 != uVar40) {
          (pIVar44->IO).KeysDown[(int)uVar40] = (pIVar44->IO).KeysDown[uVar38];
        }
        (pIVar44->IO).BackendUsingLegacyKeyArrays = '\x01';
        cVar21 = '\x01';
      }
    }
    if (cVar21 == '\x01') {
      bVar22 = (pIVar44->IO).KeyShift;
      (pIVar44->IO).KeysData[0x281].Down = (pIVar44->IO).KeyCtrl;
      (pIVar44->IO).KeysData[0x282].Down = bVar22;
      (pIVar44->IO).KeysData[0x283].Down = (pIVar44->IO).KeyAlt;
      (pIVar44->IO).KeysData[0x284].Down = (pIVar44->IO).KeySuper;
    }
  }
  IVar27 = GetMergedKeyModFlags();
  (pIVar44->IO).KeyMods = IVar27;
  uVar46 = (pIVar44->IO).BackendFlags;
  if ((uVar46 & 1) == 0) {
    for (lVar43 = 0; lVar43 != 0x180; lVar43 = lVar43 + 0x10) {
      (&(pIVar44->IO).KeysData[0x269].Down)[lVar43] = false;
      *(undefined4 *)((long)&(pIVar44->IO).KeysData[0x269].AnalogValue + lVar43) = 0;
    }
  }
  for (lVar43 = 0xe0c; lVar43 != 0x365c; lVar43 = lVar43 + 0x10) {
    IVar50.x = *(float *)((long)pIVar44 + lVar43 + -4);
    *(float *)(&pIVar44->Initialized + lVar43) = IVar50.x;
    fVar53 = -1.0;
    if ((*(char *)((long)pIVar44 + lVar43 + -8) == '\x01') && (fVar53 = 0.0, 0.0 <= IVar50.x)) {
      fVar53 = IVar50.x + (pIVar44->IO).DeltaTime;
    }
    *(float *)((long)pIVar44 + lVar43 + -4) = fVar53;
  }
  (pIVar44->IO).WantSetMousePos = false;
  uVar7 = (pIVar44->IO).ConfigFlags;
  uVar46 = uVar46 & (uVar7 & 2) >> 1;
  if ((uVar46 == 1) && ((pIVar44->IO).BackendUsingLegacyNavInputArray == false)) {
    IVar50.x = (pIVar44->IO).KeysData[0x26c].AnalogValue;
    (pIVar44->IO).NavInputs[0] = IVar50.x;
    if (0.0 < IVar50.x) {
      pIVar44->NavInputSource = ImGuiInputSource_Gamepad;
    }
    IVar50.x = (pIVar44->IO).KeysData[0x26e].AnalogValue;
    (pIVar44->IO).NavInputs[1] = IVar50.x;
    if (0.0 < IVar50.x) {
      pIVar44->NavInputSource = ImGuiInputSource_Gamepad;
    }
    IVar50.x = (pIVar44->IO).KeysData[0x26d].AnalogValue;
    (pIVar44->IO).NavInputs[3] = IVar50.x;
    if (0.0 < IVar50.x) {
      pIVar44->NavInputSource = ImGuiInputSource_Gamepad;
    }
    IVar50.x = (pIVar44->IO).KeysData[0x26b].AnalogValue;
    (pIVar44->IO).NavInputs[2] = IVar50.x;
    if (0.0 < IVar50.x) {
      pIVar44->NavInputSource = ImGuiInputSource_Gamepad;
    }
    IVar50.x = (pIVar44->IO).KeysData[0x271].AnalogValue;
    (pIVar44->IO).NavInputs[4] = IVar50.x;
    if (0.0 < IVar50.x) {
      pIVar44->NavInputSource = ImGuiInputSource_Gamepad;
    }
    IVar50.x = (pIVar44->IO).KeysData[0x272].AnalogValue;
    (pIVar44->IO).NavInputs[5] = IVar50.x;
    if (0.0 < IVar50.x) {
      pIVar44->NavInputSource = ImGuiInputSource_Gamepad;
    }
    IVar50.x = (pIVar44->IO).KeysData[0x26f].AnalogValue;
    (pIVar44->IO).NavInputs[6] = IVar50.x;
    if (0.0 < IVar50.x) {
      pIVar44->NavInputSource = ImGuiInputSource_Gamepad;
    }
    IVar50.x = (pIVar44->IO).KeysData[0x270].AnalogValue;
    (pIVar44->IO).NavInputs[7] = IVar50.x;
    if (0.0 < IVar50.x) {
      pIVar44->NavInputSource = ImGuiInputSource_Gamepad;
    }
    IVar50.x = (pIVar44->IO).KeysData[0x273].AnalogValue;
    fVar53 = (pIVar44->IO).KeysData[0x274].AnalogValue;
    (pIVar44->IO).NavInputs[0xc] = IVar50.x;
    (pIVar44->IO).NavInputs[0xd] = fVar53;
    (pIVar44->IO).NavInputs[0xe] = IVar50.x;
    (pIVar44->IO).NavInputs[0xf] = fVar53;
    (pIVar44->IO).NavInputs[8] = (pIVar44->IO).KeysData[0x27b].AnalogValue;
    (pIVar44->IO).NavInputs[9] = (pIVar44->IO).KeysData[0x27c].AnalogValue;
    (pIVar44->IO).NavInputs[10] = (pIVar44->IO).KeysData[0x279].AnalogValue;
    (pIVar44->IO).NavInputs[0xb] = (pIVar44->IO).KeysData[0x27a].AnalogValue;
  }
  if ((uVar7 & 1) != 0) {
    bVar22 = IsKeyDown(0x20c);
    if (bVar22) {
      (pIVar44->IO).NavInputs[0] = 1.0;
      pIVar44->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar22 = IsKeyDown(0x20d);
    if (bVar22) {
      (pIVar44->IO).NavInputs[2] = 1.0;
      pIVar44->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar22 = IsKeyDown(0x20e);
    if (bVar22) {
      (pIVar44->IO).NavInputs[1] = 1.0;
      pIVar44->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar22 = IsKeyDown(0x201);
    if (bVar22) {
      (pIVar44->IO).NavInputs[0x10] = 1.0;
      pIVar44->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar22 = IsKeyDown(0x202);
    if (bVar22) {
      (pIVar44->IO).NavInputs[0x11] = 1.0;
      pIVar44->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar22 = IsKeyDown(0x203);
    if (bVar22) {
      (pIVar44->IO).NavInputs[0x12] = 1.0;
      pIVar44->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar22 = IsKeyDown(0x204);
    if (bVar22) {
      (pIVar44->IO).NavInputs[0x13] = 1.0;
      pIVar44->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar44->IO).KeyCtrl == true) {
      (pIVar44->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar44->IO).KeyShift == true) {
      (pIVar44->IO).NavInputs[0xf] = 1.0;
    }
  }
  pfVar33 = (pIVar44->IO).NavInputsDownDuration;
  pfVar39 = pfVar33;
  pfVar41 = (pIVar44->IO).NavInputsDownDurationPrev;
  for (lVar43 = 0x14; lVar43 != 0; lVar43 = lVar43 + -1) {
    *pfVar41 = *pfVar39;
    pfVar39 = pfVar39 + (ulong)bVar45 * -2 + 1;
    pfVar41 = pfVar41 + (ulong)bVar45 * -2 + 1;
  }
  for (lVar43 = 0; lVar43 != 0x14; lVar43 = lVar43 + 1) {
    IVar50.x = -1.0;
    if (0.0 < (pIVar44->IO).NavInputs[lVar43]) {
      IVar50.x = 0.0;
      if (0.0 <= pfVar33[lVar43]) {
        IVar50.x = pfVar33[lVar43] + (pIVar44->IO).DeltaTime;
      }
    }
    pfVar33[lVar43] = IVar50.x;
  }
  if (pIVar44->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar44->NavInitRequest = false;
  pIVar44->NavInitRequestFromMove = false;
  pIVar44->NavInitResultId = 0;
  pIVar44->NavJustMovedToId = 0;
  if (pIVar44->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar44->NavTabbingCounter = 0;
  pIVar44->NavMoveSubmitted = false;
  pIVar44->NavMoveScoringItems = false;
  if ((((pIVar44->NavMousePosDirty == true) && (pIVar44->NavIdIsAlive == true)) &&
      (pIVar44->NavDisableHighlight == false)) && (pIVar44->NavDisableMouseHover == true)) {
    bVar22 = pIVar44->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar22 = false;
  }
  pIVar44->NavMousePosDirty = false;
  pIVar31 = pIVar44->NavWindow;
  pIVar36 = pIVar31;
  if (pIVar31 != (ImGuiWindow *)0x0) {
    for (; pIVar36 != (ImGuiWindow *)0x0; pIVar36 = pIVar36->ParentWindow) {
      if ((pIVar36->RootWindow == pIVar36) || ((pIVar36->Flags & 0x14000000) != 0)) {
        if (pIVar36 != pIVar31) {
          pIVar36->NavLastChildNavWindow = pIVar31;
        }
        break;
      }
    }
    if ((pIVar31->NavLastChildNavWindow != (ImGuiWindow *)0x0) &&
       (pIVar44->NavLayer == ImGuiNavLayer_Main)) {
      pIVar31->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar32 = GImGui;
  pIVar31 = GetTopMostPopupModal();
  if (pIVar31 != (ImGuiWindow *)0x0) {
    pIVar32->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar32->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar32->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    IVar50.x = (pIVar32->IO).DeltaTime * -10.0 + pIVar32->NavWindowingHighlightAlpha;
    IVar50.x = (float)(-(uint)(0.0 <= IVar50.x) & (uint)IVar50.x);
    pIVar32->NavWindowingHighlightAlpha = IVar50.x;
    if ((pIVar32->DimBgRatio <= 0.0) && (IVar50.x <= 0.0)) {
      pIVar32->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar31 == (ImGuiWindow *)0x0) && (pIVar32->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar23 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
    if ((pIVar32->NavWindowingTarget != (ImGuiWindow *)0x0) || ((pIVar32->IO).KeyCtrl != true))
    goto LAB_0010e7a8;
    bVar24 = IsKeyPressed(0x200,true);
  }
  else {
    bVar23 = false;
LAB_0010e7a8:
    bVar24 = false;
  }
  if (((bVar23 | bVar24) == 1) &&
     ((pIVar31 = pIVar32->NavWindow, pIVar31 != (ImGuiWindow *)0x0 ||
      (pIVar31 = FindWindowNavFocusable((pIVar32->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
      pIVar31 != (ImGuiWindow *)0x0)))) {
    pIVar31 = pIVar31->RootWindow;
    pIVar32->NavWindowingTargetAnim = pIVar31;
    pIVar32->NavWindowingTarget = pIVar31;
    pIVar32->NavWindowingTimer = 0.0;
    pIVar32->NavWindowingHighlightAlpha = 0.0;
    pIVar32->NavWindowingToggleLayer = bVar23;
    pIVar32->NavInputSource = bVar24 ^ ImGuiInputSource_Gamepad;
  }
  IVar50.x = (pIVar32->IO).DeltaTime + pIVar32->NavWindowingTimer;
  pIVar32->NavWindowingTimer = IVar50.x;
  if (pIVar32->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_0010e99d:
    bVar23 = false;
    pIVar31 = (ImGuiWindow *)0x0;
  }
  else {
    IVar28 = pIVar32->NavInputSource;
    if (IVar28 != ImGuiInputSource_Gamepad) {
LAB_0010e908:
      if (IVar28 == ImGuiInputSource_Keyboard) {
        fVar53 = (pIVar32->NavWindowingTimer + -0.2) / 0.05;
        IVar50.x = 1.0;
        if (fVar53 <= 1.0) {
          IVar50.x = fVar53;
        }
        IVar50.x = (float)(~-(uint)(fVar53 < 0.0) & (uint)IVar50.x);
        uVar47 = -(uint)(IVar50.x <= pIVar32->NavWindowingHighlightAlpha);
        pIVar32->NavWindowingHighlightAlpha =
             (float)(uVar47 & (uint)pIVar32->NavWindowingHighlightAlpha | ~uVar47 & (uint)IVar50.x);
        bVar23 = IsKeyPressed(0x200,true);
        if (bVar23) {
          NavUpdateWindowingHighlightWindow((pIVar32->IO).KeyShift - 1 | 1);
        }
        if ((pIVar32->IO).KeyCtrl == false) {
          pIVar31 = pIVar32->NavWindowingTarget;
          bVar23 = false;
          goto LAB_0010e9a2;
        }
      }
      goto LAB_0010e99d;
    }
    fVar53 = (IVar50.x + -0.2) / 0.05;
    IVar50.x = 1.0;
    if (fVar53 <= 1.0) {
      IVar50.x = fVar53;
    }
    IVar50.x = (float)(~-(uint)(fVar53 < 0.0) & (uint)IVar50.x);
    uVar47 = -(uint)(IVar50.x <= pIVar32->NavWindowingHighlightAlpha);
    pIVar32->NavWindowingHighlightAlpha =
         (float)(uVar47 & (uint)pIVar32->NavWindowingHighlightAlpha | ~uVar47 & (uint)IVar50.x);
    bVar23 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar24 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar23 - (uint)bVar24 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar23 - (uint)bVar24);
      pIVar32->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar32->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0010e99d;
      IVar28 = pIVar32->NavInputSource;
      goto LAB_0010e908;
    }
    pbVar42 = &pIVar32->NavWindowingToggleLayer;
    *pbVar42 = (bool)(*pbVar42 &
                     (pIVar32->NavWindowingHighlightAlpha <= 1.0 &&
                     pIVar32->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar42 == false) {
      pIVar31 = pIVar32->NavWindowingTarget;
      bVar23 = false;
    }
    else {
      bVar23 = pIVar32->NavWindow != (ImGuiWindow *)0x0;
      pIVar31 = (ImGuiWindow *)0x0;
    }
    pIVar32->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_0010e9a2:
  if ((((pIVar32->IO).ConfigFlags & 1) != 0) && (bVar24 = IsKeyPressed(0x283,true), bVar24)) {
    pIVar32->NavWindowingToggleLayer = true;
    pIVar32->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar32->NavWindowingToggleLayer == true) &&
     (pIVar32->NavInputSource == ImGuiInputSource_Keyboard)) {
    if ((0 < (pIVar32->IO).InputQueueCharacters.Size) ||
       ((((pIVar32->IO).KeyCtrl != false || ((pIVar32->IO).KeyShift != false)) ||
        (bVar24 = true, (pIVar32->IO).KeySuper == true)))) {
      pIVar32->NavWindowingToggleLayer = false;
      bVar24 = false;
    }
    bVar25 = IsKeyReleased(0x283);
    if (((bVar25) && (bVar24)) &&
       ((pIVar32->ActiveId == 0 || (pIVar32->ActiveIdAllowOverlap == true)))) {
      bVar23 = (bool)(((pIVar32->IO).MousePosPrev.x < -256000.0 ||
                      (pIVar32->IO).MousePosPrev.y < -256000.0) !=
                      (-256000.0 <= (pIVar32->IO).MousePos.x &&
                      -256000.0 <= (pIVar32->IO).MousePos.y) | bVar23);
    }
    bVar24 = IsKeyDown(0x283);
    if (!bVar24) {
      pIVar32->NavWindowingToggleLayer = false;
    }
  }
  pIVar36 = pIVar32->NavWindowingTarget;
  if ((pIVar36 != (ImGuiWindow *)0x0) && ((pIVar36->Flags & 4) == 0)) {
    if (pIVar32->NavInputSource == ImGuiInputSource_Gamepad) {
      dir_sources = 8;
LAB_0010eb8c:
      IVar49 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
    }
    else {
      IVar49.x = 0.0;
      IVar49.y = 0.0;
      if ((pIVar32->NavInputSource == ImGuiInputSource_Keyboard) &&
         ((pIVar32->IO).KeyShift == false)) {
        dir_sources = 1;
        goto LAB_0010eb8c;
      }
    }
    IVar62 = _local_88;
    IVar50.x = IVar49.y;
    if (((IVar49.x != 0.0) || (IVar50.x != 0.0)) || (NAN(IVar50.x))) {
      fVar53 = (pIVar32->IO).DisplayFramebufferScale.x;
      fVar58 = (pIVar32->IO).DisplayFramebufferScale.y;
      if (fVar58 <= fVar53) {
        fVar53 = fVar58;
      }
      fVar53 = (float)(int)(fVar53 * (pIVar32->IO).DeltaTime * 800.0);
      pIVar36 = pIVar36->RootWindow;
      local_88._4_4_ = (pIVar36->Pos).y + IVar50.x * fVar53;
      local_88._0_4_ = (pIVar36->Pos).x + IVar49.x * fVar53;
      IStack_80 = IVar62.Max;
      SetWindowPos(pIVar36,(ImVec2 *)local_88,1);
      MarkIniSettingsDirty(pIVar36);
      pIVar32->NavDisableMouseHover = true;
    }
  }
  if (pIVar31 != (ImGuiWindow *)0x0) {
    if ((pIVar32->NavWindow == (ImGuiWindow *)0x0) || (pIVar31 != pIVar32->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar19 = GImGui;
      pIVar19->NavMousePosDirty = true;
      pIVar19->NavDisableHighlight = false;
      pIVar19->NavDisableMouseHover = true;
      pIVar36 = pIVar31->NavLastChildNavWindow;
      if ((pIVar36 == (ImGuiWindow *)0x0) || (pIVar36->WasActive == false)) {
        pIVar36 = pIVar31;
      }
      ClosePopupsOverWindow(pIVar36,false);
      FocusWindow(pIVar36);
      if (pIVar36->NavLastIds[0] == 0) {
        NavInitWindow(pIVar36,false);
      }
      if ((pIVar36->DC).NavLayersActiveMaskNext == 2) {
        pIVar32->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar32->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar23) && (pIVar32->NavWindow != (ImGuiWindow *)0x0)) {
    ClearActiveID();
    pIVar31 = pIVar32->NavWindow;
    pIVar36 = pIVar31;
    do {
      window = pIVar36;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar36 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar31) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar31;
      pIVar31 = pIVar32->NavWindow;
    }
    IVar8 = pIVar32->NavLayer;
    if (((pIVar31->DC).NavLayersActiveMask & 2) == 0) {
      layer = ImGuiNavLayer_Main;
      if (IVar8 == ImGuiNavLayer_Main) goto LAB_0010ed95;
    }
    else if (IVar8 == ImGuiNavLayer_Main) {
      pIVar31->NavLastIds[1] = 0;
      layer = ImGuiNavLayer_Menu;
    }
    else {
      layer = IVar8 ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(layer);
    pIVar32 = GImGui;
    pIVar32->NavMousePosDirty = true;
    pIVar32->NavDisableHighlight = false;
    pIVar32->NavDisableMouseHover = true;
  }
LAB_0010ed95:
  local_98._0_1_ = (char)uVar46;
  cVar21 = (char)local_98;
  if (((uVar7 & 1) == 0 && (char)local_98 == '\0') || (pIVar44->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar44->IO).NavActive = false;
LAB_0010eddd:
    bVar23 = pIVar44->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar23 = (pIVar44->NavWindow->Flags & 0x40000U) == 0;
    (pIVar44->IO).NavActive = bVar23;
    if (((!bVar23) || (pIVar44->NavId == 0)) ||
       (bVar23 = true, pIVar44->NavDisableHighlight != false)) goto LAB_0010eddd;
  }
  (pIVar44->IO).NavVisible = bVar23;
  pIVar32 = GImGui;
  bVar23 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar23) {
    if (pIVar32->ActiveId == 0) {
      if (pIVar32->NavLayer == ImGuiNavLayer_Main) {
        pIVar31 = pIVar32->NavWindow;
        if (pIVar31 == (ImGuiWindow *)0x0) {
          uVar46 = (pIVar32->OpenPopupStack).Size;
          if (0 < (int)uVar46) {
LAB_0010f390:
            if ((((pIVar32->OpenPopupStack).Data[(ulong)uVar46 - 1].Window)->Flags & 0x8000000) == 0
               ) {
              ClosePopupToLevel(uVar46 - 1,true);
            }
            goto LAB_0010ee53;
          }
        }
        else {
          if (((pIVar31 != pIVar31->RootWindow) && ((pIVar31->Flags & 0x4000000) == 0)) &&
             (pIVar36 = pIVar31->ParentWindow, pIVar36 != (ImGuiWindow *)0x0)) {
            _local_88 = ImGuiWindow::Rect(pIVar31);
            FocusWindow(pIVar36);
            IVar35 = pIVar31->ChildId;
            IVar62 = WindowRectAbsToRel(pIVar36,(ImRect *)local_88);
            pIVar32 = GImGui;
            GImGui->NavId = IVar35;
            pIVar32->NavLayer = ImGuiNavLayer_Main;
            pIVar32->NavFocusScopeId = 0;
            pIVar31 = pIVar32->NavWindow;
            pIVar31->NavLastIds[0] = IVar35;
            pIVar31->NavRectRel[0] = IVar62;
            goto LAB_0010ee43;
          }
          uVar46 = (pIVar32->OpenPopupStack).Size;
          if (0 < (int)uVar46) goto LAB_0010f390;
          if ((pIVar31->Flags & 0x5000000U) != 0x1000000) {
            pIVar31->NavLastIds[0] = 0;
          }
        }
        pIVar32->NavId = 0;
        pIVar32->NavFocusScopeId = 0;
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
        pIVar32 = GImGui;
LAB_0010ee43:
        pIVar32->NavMousePosDirty = true;
        pIVar32->NavDisableHighlight = false;
        pIVar32->NavDisableMouseHover = true;
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
LAB_0010ee53:
  pIVar44->NavActivateFlags = 0;
  pIVar44->NavActivateId = 0;
  pIVar44->NavActivateDownId = 0;
  pIVar44->NavActivatePressedId = 0;
  pIVar44->NavActivateInputId = 0;
  if (((pIVar44->NavId == 0) || (pIVar44->NavDisableHighlight != false)) ||
     (pIVar44->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_0010ee88:
    if ((pIVar44->NavWindow != (ImGuiWindow *)0x0) && ((pIVar44->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar44->NavDisableHighlight = true;
    }
  }
  else if (pIVar44->NavWindow != (ImGuiWindow *)0x0) {
    if ((pIVar44->NavWindow->Flags & 0x40000) != 0) goto LAB_0010ee88;
    IVar50.x = (GImGui->IO).NavInputs[0];
    fVar53 = (GImGui->IO).NavInputs[2];
    if (0.0 < IVar50.x) {
      bVar23 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
    }
    else {
      bVar23 = false;
    }
    if (fVar53 <= 0.0) {
      bVar24 = false;
    }
    else {
      bVar24 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
    }
    IVar35 = pIVar44->ActiveId;
    if (bVar23 == true && IVar35 == 0) {
      pIVar44->NavActivateId = pIVar44->NavId;
      pIVar44->NavActivateFlags = 2;
LAB_0010f486:
      if (bVar24 != false) {
        pIVar44->NavActivateInputId = pIVar44->NavId;
        pIVar44->NavActivateFlags = 1;
      }
      if (0.0 < IVar50.x) {
        pIVar44->NavActivateDownId = pIVar44->NavId;
      }
      if (bVar23 == false) goto LAB_0010ee88;
      IVar35 = pIVar44->NavId;
    }
    else {
      if (IVar35 == 0) goto LAB_0010f486;
      IVar26 = pIVar44->NavId;
      if ((bVar24 & IVar35 == IVar26) != 0) {
        pIVar44->NavActivateInputId = IVar35;
        pIVar44->NavActivateFlags = 1;
      }
      if (IVar35 == IVar26 && 0.0 < IVar50.x) {
        pIVar44->NavActivateDownId = IVar35;
      }
      if ((bVar23 & IVar35 == IVar26) == 0) goto LAB_0010ee88;
    }
    pIVar44->NavActivatePressedId = IVar35;
    goto LAB_0010ee88;
  }
  IVar35 = pIVar44->NavNextActivateId;
  if (IVar35 != 0) {
    if ((pIVar44->NavNextActivateFlags & 1U) == 0) {
      pIVar44->NavActivatePressedId = IVar35;
      pIVar44->NavActivateDownId = IVar35;
      pIVar44->NavActivateId = IVar35;
    }
    else {
      pIVar44->NavActivateInputId = IVar35;
    }
    pIVar44->NavActivateFlags = pIVar44->NavNextActivateFlags;
  }
  pIVar44->NavNextActivateId = 0;
  pIVar32 = GImGui;
  pIVar31 = GImGui->NavWindow;
  if ((pIVar31 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) != 1) {
    GImGui->NavMoveDir = -1;
    pIVar32->NavMoveFlags = 0;
    pIVar32->NavMoveScrollFlags = 0;
    if (((pIVar31 != (ImGuiWindow *)0x0) && (pIVar32->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar31->Flags & 0x40000) == 0)) {
      if (((pIVar32->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar23 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar23 ||
          (bVar23 = IsNavInputTest(0x10,ImGuiInputReadMode_Repeat), bVar23)))) {
        pIVar32->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar23 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar23 ||
          (bVar23 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar23)))) {
        pIVar32->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar23 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar23 ||
          (bVar23 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar23)))) {
        pIVar32->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar23 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar23 ||
          (bVar23 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar23)))) {
        pIVar32->NavMoveDir = 3;
      }
    }
    IVar29 = pIVar32->NavMoveDir;
    pIVar32->NavMoveClipDir = IVar29;
    (pIVar32->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar32->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar32->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar32->NavScoringNoClipRect).Max.y = -3.4028235e+38;
    if (pIVar31 != (ImGuiWindow *)0x0) goto LAB_0010f048;
    goto LAB_0010f641;
  }
  IVar29 = GImGui->NavMoveDir;
LAB_0010f048:
  pIVar19 = GImGui;
  IVar50.x = 0.0;
  if ((IVar29 == -1) && (((pIVar32->IO).ConfigFlags & 1U) != 0)) {
    pIVar36 = GImGui->NavWindow;
    if (((pIVar36->Flags & 0x40000) == 0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) {
      bVar23 = IsKeyDown(0x205);
      local_98 = 0;
      uVar38 = 0;
      if (bVar23) {
        uVar38 = (ulong)(((pIVar19->ActiveIdUsingKeyInputMask).Storage[0] & 0x20) == 0);
      }
      local_58 = CONCAT44(local_58._4_4_,(int)uVar38);
      bVar23 = IsKeyDown(0x206);
      if (bVar23) {
        local_98 = (uint)(((pIVar19->ActiveIdUsingKeyInputMask).Storage[0] & 0x40) == 0);
      }
      bVar23 = IsKeyPressed(0x207,true);
      if (bVar23) {
        local_68 = (float)CONCAT71(extraout_var,
                                   ((pIVar19->ActiveIdUsingKeyInputMask).Storage[0] & 0x80) == 0);
      }
      else {
        local_68 = 0.0;
      }
      bVar23 = IsKeyPressed(0x208,true);
      if (bVar23) {
        IVar50.x = (float)CONCAT71((int7)(uVar38 >> 8),
                                   ((pIVar19->ActiveIdUsingKeyInputMask).Storage[0] & 0x100) == 0);
      }
      else {
        IVar50.x = 0.0;
      }
      if (((uint)local_58 != local_98) || (SUB41(local_68,0) != SUB41(IVar50.x,0))) {
        local_78 = IVar50.x;
        if (pIVar19->NavLayer != ImGuiNavLayer_Main) {
          NavRestoreLayer(ImGuiNavLayer_Main);
        }
        if (((pIVar36->DC).NavLayersActiveMask == 0) && ((pIVar36->DC).NavHasScroll == true)) {
          bVar23 = IsKeyPressed(0x205,true);
          if (bVar23) {
            (pIVar36->ScrollTarget).y =
                 (pIVar36->Scroll).y - ((pIVar36->InnerRect).Max.y - (pIVar36->InnerRect).Min.y);
            (pIVar36->ScrollTargetCenterRatio).y = 0.0;
            (pIVar36->ScrollTargetEdgeSnapDist).y = 0.0;
          }
          else {
            bVar23 = IsKeyPressed(0x206,true);
            if (!bVar23) {
              if (local_68._0_1_ == '\0') {
                if (local_78._0_1_ == '\0') goto LAB_0010f22a;
                (pIVar36->ScrollTarget).y = (pIVar36->ScrollMax).y;
              }
              else {
                (pIVar36->ScrollTarget).y = 0.0;
              }
              (pIVar36->ScrollTargetCenterRatio).y = 0.0;
              (pIVar36->ScrollTargetEdgeSnapDist).y = 0.0;
              goto LAB_0010f22a;
            }
            (pIVar36->ScrollTarget).y =
                 ((pIVar36->InnerRect).Max.y - (pIVar36->InnerRect).Min.y) + (pIVar36->Scroll).y;
            (pIVar36->ScrollTargetCenterRatio).y = 0.0;
            (pIVar36->ScrollTargetEdgeSnapDist).y = 0.0;
          }
LAB_0010f641:
          IVar50.x = 0.0;
        }
        else {
          local_58 = (ulong)pIVar19->NavLayer << 4;
          IVar50.x = (pIVar36->InnerRect).Max.y;
          fVar53 = (pIVar36->InnerRect).Min.y;
          fVar58 = ImGuiWindow::CalcFontSize(pIVar36);
          IVar50.x = (*(float *)((long)&pIVar36->NavRectRel[0].Max.y + local_58) -
                     *(float *)((long)&pIVar36->NavRectRel[0].Min.y + local_58)) +
                     ((IVar50.x - fVar53) - fVar58);
          IVar50.x = (float)(~-(uint)(IVar50.x <= 0.0) & (uint)IVar50.x);
          bVar23 = IsKeyPressed(0x205,true);
          if (bVar23) {
            IVar50.x = -IVar50.x;
            IVar29 = 2;
            IVar30 = 3;
          }
          else {
            bVar23 = IsKeyPressed(0x206,true);
            if (!bVar23) {
              pfVar33 = (float *)((long)&pIVar36->NavRectRel[0].Min.x + local_58);
              if (local_68._0_1_ == '\0') {
                if (local_78._0_1_ != '\0') {
                  IVar50.x = (pIVar36->ContentSize).y;
                  *(float *)((long)&pIVar36->NavRectRel[0].Max.y + local_58) = IVar50.x;
                  *(float *)((long)&pIVar36->NavRectRel[0].Min.y + local_58) = IVar50.x;
                  pfVar39 = (float *)((long)&pIVar36->NavRectRel[0].Max.x + local_58);
                  if (*pfVar39 <= *pfVar33 && *pfVar33 != *pfVar39) {
                    *(undefined4 *)((long)&pIVar36->NavRectRel[0].Max.x + local_58) = 0;
                    *pfVar33 = 0.0;
                  }
                  pIVar19->NavMoveDir = 2;
                  pIVar19->NavMoveFlags = 0x50;
                }
              }
              else {
                *(undefined4 *)((long)&pIVar36->NavRectRel[0].Max.y + local_58) = 0;
                *(undefined4 *)((long)&pIVar36->NavRectRel[0].Min.y + local_58) = 0;
                pfVar39 = (float *)((long)&pIVar36->NavRectRel[0].Max.x + local_58);
                if (*pfVar39 <= *pfVar33 && *pfVar33 != *pfVar39) {
                  *(undefined4 *)((long)&pIVar36->NavRectRel[0].Max.x + local_58) = 0;
                  *pfVar33 = 0.0;
                }
                pIVar19->NavMoveDir = 3;
                pIVar19->NavMoveFlags = 0x50;
              }
              goto LAB_0010f22a;
            }
            IVar30 = 2;
            IVar29 = 3;
          }
          pIVar19->NavMoveDir = IVar30;
          pIVar19->NavMoveClipDir = IVar29;
          pIVar19->NavMoveFlags = 0x30;
          if ((IVar50.x != 0.0) || (NAN(IVar50.x))) {
            IVar49 = (pIVar31->InnerRect).Max;
            (pIVar32->NavScoringNoClipRect).Min = (pIVar31->InnerRect).Min;
            (pIVar32->NavScoringNoClipRect).Max = IVar49;
            (pIVar32->NavScoringNoClipRect).Min.y = (pIVar32->NavScoringNoClipRect).Min.y + IVar50.x
            ;
            (pIVar32->NavScoringNoClipRect).Max.y = (pIVar32->NavScoringNoClipRect).Max.y + IVar50.x
            ;
          }
        }
        goto LAB_0010f644;
      }
    }
LAB_0010f22a:
    IVar50.x = 0.0;
  }
LAB_0010f644:
  pIVar32->NavMoveForwardToNextFrame = false;
  if (pIVar32->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar32->NavMoveDir,pIVar32->NavMoveClipDir,pIVar32->NavMoveFlags,
               pIVar32->NavMoveScrollFlags);
  }
  if (pIVar32->NavMoveSubmitted == true) {
    if (pIVar32->NavId == 0) {
      pIVar32->NavInitRequest = true;
      pIVar32->NavInitRequestFromMove = true;
      pIVar32->NavInitResultId = 0;
      pIVar32->NavDisableHighlight = false;
    }
    if ((pIVar32->NavInputSource != ImGuiInputSource_Gamepad) ||
       (pIVar32->NavLayer != ImGuiNavLayer_Main || pIVar31 == (ImGuiWindow *)0x0))
    goto LAB_0010f830;
    local_b8._0_4_ = -(uint)((pIVar32->NavMoveFlags & 5U) == 0);
    local_b8._4_4_ = -(uint)((pIVar32->NavMoveFlags & 10U) == 0);
    local_b8._8_4_ = 0xffffffff;
    local_b8._12_4_ = 0xffffffff;
    local_48.Min.y = (pIVar31->InnerRect).Min.y + -1.0;
    local_48.Min.x = (pIVar31->InnerRect).Min.x + -1.0;
    local_48.Max.y = (pIVar31->InnerRect).Max.y + 1.0;
    local_48.Max.x = (pIVar31->InnerRect).Max.x + 1.0;
    _local_88 = WindowRectAbsToRel(pIVar31,&local_48);
    auVar59._4_4_ = local_b8._4_4_;
    auVar59._0_4_ = local_b8._4_4_;
    auVar59._8_4_ = local_b8._4_4_;
    auVar59._12_4_ = local_b8._4_4_;
    if ((((auVar59 | local_b8) & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (bVar23 = ImRect::Contains((ImRect *)local_88,pIVar31->NavRectRel + pIVar32->NavLayer),
       !bVar23)) {
      local_58 = local_b8._0_8_;
      local_78 = local_88._0_4_;
      fStack_74 = local_88._4_4_;
      fStack_70 = local_88._8_4_;
      fStack_6c = local_88._12_4_;
      iStack_50 = local_b8._0_4_;
      iStack_4c = local_b8._4_4_;
      local_68 = ImGuiWindow::CalcFontSize(pIVar31);
      local_78 = fStack_70 - local_78;
      fStack_74 = IStack_80.y - (float)local_88._4_4_;
      fStack_70 = fStack_6c - fStack_70;
      fStack_6c = 0.0 - fStack_6c;
      fStack_64 = extraout_XMM0_Db;
      fVar53 = ImGuiWindow::CalcFontSize(pIVar31);
      auVar55._0_4_ = local_68 * 0.5;
      auVar55._4_4_ = fVar53 * 0.5;
      auVar55._8_4_ = fStack_64 * 0.0;
      auVar55._12_4_ = extraout_XMM0_Db_00 * 0.0;
      auVar16._4_4_ = fStack_74;
      auVar16._0_4_ = local_78;
      auVar16._8_4_ = fStack_70;
      auVar16._12_4_ = fStack_6c;
      auVar59 = minps(auVar16,auVar55);
      fVar53 = local_88._0_4_;
      fVar58 = local_88._4_4_;
      auVar14._4_4_ = local_88._8_8_.x;
      auVar14._8_4_ = local_88._8_8_.y;
      auVar14._0_4_ = fVar58 - extraout_XMM0_Db_00;
      auVar56._0_8_ = auVar14._0_8_ << 0x20;
      auVar56._8_4_ = local_88._8_4_ - auVar59._0_4_;
      auVar56._12_4_ = local_88._12_4_ - auVar59._4_4_;
      IStack_80 = (ImVec2)(~CONCAT44(iStack_4c,iStack_50) & 0x7f7fffff7f7fffff |
                          auVar56._8_8_ & CONCAT44(iStack_4c,iStack_50));
      local_88 = (undefined1  [8])
                 (~local_58 & 0xff7fffffff7fffff |
                 CONCAT44(auVar59._4_4_ + fVar58,auVar59._0_4_ + fVar53) & local_58);
      ImRect::ClipWithFull(pIVar31->NavRectRel + pIVar32->NavLayer,(ImRect *)local_88);
      pIVar32->NavId = 0;
      pIVar32->NavFocusScopeId = 0;
    }
LAB_0010f841:
    IVar8 = pIVar32->NavLayer;
    fVar53 = pIVar31->NavRectRel[IVar8].Min.x;
    pIVar2 = &pIVar31->NavRectRel[IVar8].Max;
    if ((pIVar2->x <= fVar53 && fVar53 != pIVar2->x) ||
       (fVar53 = pIVar31->NavRectRel[IVar8].Min.y, pfVar33 = &pIVar31->NavRectRel[IVar8].Max.y,
       *pfVar33 <= fVar53 && fVar53 != *pfVar33)) {
      local_48.Min.x = 0.0;
      local_48.Min.y = 0.0;
      local_48.Max.x = 0.0;
      local_48.Max.y = 0.0;
    }
    else {
      local_48.Min = pIVar31->NavRectRel[IVar8].Min;
      local_48.Max = pIVar31->NavRectRel[IVar8].Max;
    }
    IVar62 = WindowRectRelToAbs(pIVar31,&local_48);
    fVar53 = IVar62.Min.x + 1.0;
    auVar17._4_4_ = IStack_80.x;
    auVar17._8_4_ = IStack_80.y;
    auVar17._0_4_ = IVar62.Min.y + IVar50.x;
    _local_88 = auVar17 << 0x20;
    if (IVar62.Max.x <= fVar53) {
      fVar53 = IVar62.Max.x;
    }
    IVar50.x = IVar62.Max.y + IVar50.x;
    IStack_80.y = IVar50.x;
    local_88._0_4_ = fVar53;
    IStack_80.x = fVar53;
  }
  else {
LAB_0010f830:
    _local_88 = (ImRect)ZEXT816(0);
    if (pIVar31 != (ImGuiWindow *)0x0) goto LAB_0010f841;
  }
  IVar62 = _local_88;
  (pIVar32->NavScoringRect).Min.x = (float)local_88._0_4_;
  (pIVar32->NavScoringRect).Min.y = (float)local_88._4_4_;
  (pIVar32->NavScoringRect).Max = IStack_80;
  _local_88 = IVar62;
  ImRect::Add(&pIVar32->NavScoringNoClipRect,(ImRect *)local_88);
  pIVar32 = GImGui;
  if ((((((pIVar44->NavMoveDir == -1) &&
         (pIVar31 = GImGui->NavWindow, pIVar31 != (ImGuiWindow *)0x0)) &&
        (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       (((pIVar31->Flags & 0x40000) == 0 && (bVar23 = IsKeyPressed(0x200,true), bVar23)))) &&
      (((pIVar32->ActiveIdUsingKeyInputMask).Storage[0] & 1) == 0)) &&
     (((pIVar32->IO).KeyCtrl == false && ((pIVar32->IO).KeyAlt == false)))) {
    if ((pIVar32->IO).KeyShift == false) {
      uVar46 = (uint)(pIVar32->ActiveId != 0);
    }
    else {
      uVar46 = 0xffffffff;
    }
    pIVar32->NavTabbingDir = uVar46;
    scroll_flags = 3;
    if (pIVar31->Appearing != false) {
      scroll_flags = 0x21;
    }
    NavMoveRequestSubmit(-1,uVar46 >> 0x1f ^ 3,0x400,scroll_flags);
    (pIVar32->NavTabbingResultFirst).InFlags = 0;
    (pIVar32->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
    (pIVar32->NavTabbingResultFirst).ID = 0;
    (pIVar32->NavTabbingResultFirst).FocusScopeId = 0;
    (pIVar32->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
    (pIVar32->NavTabbingResultFirst).DistBox = 3.4028235e+38;
    (pIVar32->NavTabbingResultFirst).DistCenter = 3.4028235e+38;
    pIVar32->NavTabbingCounter = -1;
    pIVar32 = GImGui;
  }
  bVar23 = true;
  if (pIVar32->NavMoveScoringItems == false) {
    bVar23 = pIVar32->NavInitRequest;
  }
  pIVar32->NavAnyRequest = bVar23;
  pIVar44->NavIdIsAlive = false;
  pIVar31 = pIVar44->NavWindow;
  if (((pIVar31 != (ImGuiWindow *)0x0) && ((pIVar31->Flags & 0x40000) == 0)) &&
     (pIVar44->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    IVar50.x = ImGuiWindow::CalcFontSize(pIVar31);
    IVar50.x = (float)(int)(IVar50.x * 100.0 * (pIVar44->IO).DeltaTime + 0.5);
    if (((pIVar31->DC).NavLayersActiveMask == 0) &&
       (uVar46 = pIVar44->NavMoveDir, (uVar46 != 0xffffffff & (pIVar31->DC).NavHasScroll) == 1)) {
      if (uVar46 < 2) {
        (pIVar31->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0016d520 + (ulong)(uVar46 == 0) * 4) * IVar50.x +
                         (pIVar31->Scroll).x);
        (pIVar31->ScrollTargetCenterRatio).x = 0.0;
        (pIVar31->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar46 & 0xfffffffe) == 2) {
        (pIVar31->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0016d520 + (ulong)(uVar46 == 2) * 4) * IVar50.x +
                         (pIVar31->Scroll).y);
        (pIVar31->ScrollTargetCenterRatio).y = 0.0;
        (pIVar31->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar49 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.1,10.0);
    fVar53 = IVar49.x;
    fVar58 = IVar49.y;
    if (((fVar53 != 0.0) || (NAN(fVar53))) && (pIVar31->ScrollbarX == true)) {
      (pIVar31->ScrollTarget).x = (float)(int)(fVar53 * IVar50.x + (pIVar31->Scroll).x);
      (pIVar31->ScrollTargetCenterRatio).x = 0.0;
      (pIVar31->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar58 != 0.0) || (NAN(fVar58))) {
      (pIVar31->ScrollTarget).y = (float)(int)(fVar58 * IVar50.x + (pIVar31->Scroll).y);
      (pIVar31->ScrollTargetCenterRatio).y = 0.0;
      (pIVar31->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar7 & 1) == 0 && cVar21 == '\0') {
    pIVar44->NavDisableHighlight = true;
    pIVar44->NavDisableMouseHover = false;
  }
  else if (((bVar22) && (((pIVar44->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar44->IO).BackendFlags & 4) != 0)) {
    IVar50 = NavCalcPreferredRefPos();
    (pIVar44->IO).MousePosPrev = IVar50;
    (pIVar44->IO).MousePos = IVar50;
    (pIVar44->IO).WantSetMousePos = true;
  }
  pIVar44->NavScoringDebugCount = 0;
  pIVar44 = GImGui;
  IVar50.x = (GImGui->IO).MousePos.x;
  fVar53 = (GImGui->IO).MousePos.y;
  if ((-256000.0 <= IVar50.x) && (-256000.0 <= fVar53)) {
    IVar50.x = ImFloorSigned(IVar50.x);
    fVar53 = ImFloorSigned(fVar53);
    IVar50.y = fVar53;
    pIVar44->MouseLastValidPos = IVar50;
    (pIVar44->IO).MousePos = IVar50;
  }
  if (((IVar50.x < -256000.0) || (fVar53 < -256000.0)) ||
     ((fVar58 = (pIVar44->IO).MousePosPrev.x, fVar58 < -256000.0 ||
      (fVar48 = (pIVar44->IO).MousePosPrev.y, fVar48 < -256000.0)))) {
    (pIVar44->IO).MouseDelta.x = 0.0;
    (pIVar44->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar50.x = IVar50.x - fVar58;
    fVar48 = fVar53 - fVar48;
    IVar54.y = fVar48;
    IVar54.x = IVar50.x;
    (pIVar44->IO).MouseDelta = IVar54;
    if (((IVar50.x != 0.0) || (fVar48 != 0.0)) || (NAN(fVar48))) {
      pIVar44->NavDisableMouseHover = false;
    }
  }
  IVar50.x = (pIVar44->IO).MousePos.x;
  fVar58 = (pIVar44->IO).MousePos.y;
  (pIVar44->IO).MousePosPrev.x = IVar50.x;
  (pIVar44->IO).MousePosPrev.y = fVar58;
  for (lVar43 = 0; lVar43 != 5; lVar43 = lVar43 + 1) {
    if ((pIVar44->IO).MouseDown[lVar43] == true) {
      fVar48 = (pIVar44->IO).MouseDownDuration[lVar43];
      pbVar42 = (pIVar44->IO).MouseClicked + lVar43;
      *pbVar42 = fVar48 < 0.0;
      (pIVar44->IO).MouseClickedCount[lVar43] = 0;
      pbVar42[0x1e] = false;
      (pIVar44->IO).MouseDownDurationPrev[lVar43] = fVar48;
      if (0.0 <= fVar48) {
        (pIVar44->IO).MouseDownDuration[lVar43] = fVar48 + (pIVar44->IO).DeltaTime;
        fVar48 = 0.0;
        if (-256000.0 <= fVar53 && -256000.0 <= IVar50.x) {
          fVar48 = IVar50.x - (pIVar44->IO).MouseClickedPos[lVar43].x;
          fVar61 = fVar53 - (pIVar44->IO).MouseClickedPos[lVar43].y;
          fVar48 = fVar48 * fVar48 + fVar61 * fVar61;
        }
        fVar61 = (pIVar44->IO).MouseDragMaxDistanceSqr[lVar43];
        uVar46 = -(uint)(fVar48 <= fVar61);
        (pIVar44->IO).MouseDragMaxDistanceSqr[lVar43] =
             (float)(~uVar46 & (uint)fVar48 | (uint)fVar61 & uVar46);
        goto LAB_0010fd7c;
      }
      (pIVar44->IO).MouseDownDuration[lVar43] = 0.0;
      dVar5 = pIVar44->Time;
      if ((pIVar44->IO).MouseDoubleClickTime <=
          (float)(dVar5 - (pIVar44->IO).MouseClickedTime[lVar43])) {
LAB_0010fd81:
        (pIVar44->IO).MouseClickedLastCount[lVar43] = 1;
      }
      else {
        fVar48 = 0.0;
        fVar61 = 0.0;
        if (-256000.0 <= fVar53 && -256000.0 <= IVar50.x) {
          IVar49 = (pIVar44->IO).MouseClickedPos[lVar43];
          fVar48 = IVar50.x - IVar49.x;
          fVar61 = fVar53 - IVar49.y;
        }
        fVar4 = (pIVar44->IO).MouseDoubleClickMaxDist;
        if (fVar4 * fVar4 <= fVar48 * fVar48 + fVar61 * fVar61) goto LAB_0010fd81;
        pIVar3 = (pIVar44->IO).MouseClickedLastCount + lVar43;
        *pIVar3 = *pIVar3 + 1;
      }
      (pIVar44->IO).MouseClickedTime[lVar43] = dVar5;
      pIVar2 = (pIVar44->IO).MouseClickedPos + lVar43;
      pIVar2->x = IVar50.x;
      pIVar2->y = fVar58;
      IVar6 = (pIVar44->IO).MouseClickedLastCount[lVar43];
      (pIVar44->IO).MouseClickedCount[lVar43] = IVar6;
      (pIVar44->IO).MouseDragMaxDistanceSqr[lVar43] = 0.0;
      bVar22 = IVar6 == 2;
    }
    else {
      (pIVar44->IO).MouseClicked[lVar43] = false;
      (pIVar44->IO).MouseClickedCount[lVar43] = 0;
      fVar48 = (pIVar44->IO).MouseDownDuration[lVar43];
      (pIVar44->IO).MouseReleased[lVar43] = 0.0 <= fVar48;
      pbVar42 = (pIVar44->IO).MouseClicked + lVar43;
      (pIVar44->IO).MouseDownDurationPrev[lVar43] = fVar48;
      (pIVar44->IO).MouseDownDuration[lVar43] = -1.0;
LAB_0010fd7c:
      bVar22 = false;
    }
    (pIVar44->IO).MouseDoubleClicked[lVar43] = bVar22;
    if (*pbVar42 == true) {
      pIVar44->NavDisableMouseHover = false;
    }
  }
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar31 = GetTopMostPopupModal();
  if ((pIVar31 != (ImGuiWindow *)0x0) ||
     ((ctx->NavWindowingTarget != (ImGuiWindow *)0x0 && (0.0 < ctx->NavWindowingHighlightAlpha)))) {
    IVar50.x = (ctx->IO).DeltaTime * 6.0 + ctx->DimBgRatio;
    if (1.0 <= IVar50.x) {
      IVar50.x = 1.0;
    }
    ctx->DimBgRatio = IVar50.x;
  }
  else {
    IVar50.x = (ctx->IO).DeltaTime * -10.0 + ctx->DimBgRatio;
    ctx->DimBgRatio = (float)(-(uint)(0.0 <= IVar50.x) & (uint)IVar50.x);
  }
  ctx->MouseCursor = 0;
  ctx->WantTextInputNextFrame = -1;
  ctx->WantCaptureMouseNextFrame = -1;
  ctx->WantCaptureKeyboardNextFrame = -1;
  uVar20 = *(undefined3 *)&(ctx->PlatformImeData).field_0x1;
  IVar50.x = (ctx->PlatformImeData).InputPos.x;
  uVar15 = *(undefined8 *)&(ctx->PlatformImeData).InputPos.y;
  (ctx->PlatformImeDataPrev).WantVisible = (ctx->PlatformImeData).WantVisible;
  *(undefined3 *)&(ctx->PlatformImeDataPrev).field_0x1 = uVar20;
  (ctx->PlatformImeDataPrev).InputPos.x = IVar50.x;
  *(undefined8 *)&(ctx->PlatformImeDataPrev).InputPos.y = uVar15;
  (ctx->PlatformImeData).WantVisible = false;
  pIVar44 = GImGui;
  pIVar31 = GImGui->WheelingWindow;
  if (pIVar31 == (ImGuiWindow *)0x0) {
LAB_0010ffa8:
    pIVar31 = (ImGuiWindow *)0x0;
  }
  else {
    fVar53 = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    GImGui->WheelingWindowTimer = fVar53;
    IVar50.x = (pIVar44->IO).MousePos.x;
    if ((((-256000.0 <= IVar50.x) && (fVar58 = (pIVar44->IO).MousePos.y, -256000.0 <= fVar58)) &&
        (IVar50.x = IVar50.x - (pIVar44->WheelingWindowRefMousePos).x,
        fVar58 = fVar58 - (pIVar44->WheelingWindowRefMousePos).y,
        fVar48 = (pIVar44->IO).MouseDragThreshold,
        fVar48 * fVar48 < IVar50.x * IVar50.x + fVar58 * fVar58)) || (fVar53 <= 0.0)) {
      pIVar44->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar44->WheelingWindowTimer = 0.0;
      goto LAB_0010ffa8;
    }
  }
  IVar50.x = (pIVar44->IO).MouseWheel;
  if ((((((IVar50.x != 0.0) || (fVar53 = (pIVar44->IO).MouseWheelH, fVar53 != 0.0)) || (NAN(fVar53))
        ) && ((pIVar44->ActiveId == 0 || (pIVar44->ActiveIdUsingMouseWheel == false)))) &&
      ((pIVar44->HoveredIdPreviousFrame == 0 ||
       (pIVar44->HoveredIdPreviousFrameUsingMouseWheel == false)))) &&
     (((pIVar31 != (ImGuiWindow *)0x0 ||
       (pIVar31 = pIVar44->HoveredWindow, pIVar31 != (ImGuiWindow *)0x0)) &&
      (pIVar31->Collapsed == false)))) {
    bVar22 = (pIVar44->IO).KeyCtrl;
    if ((IVar50.x != 0.0) || (NAN(IVar50.x))) {
      if ((bVar22 & 1U) != 0) {
        if ((pIVar44->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar31);
          IVar62 = _local_88;
          IVar50.x = pIVar31->FontWindowScale;
          fVar58 = (pIVar44->IO).MouseWheel * 0.1 + IVar50.x;
          fVar53 = 2.5;
          if (fVar58 <= 2.5) {
            fVar53 = fVar58;
          }
          fVar53 = (float)(-(uint)(fVar58 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar58 < 0.5) & (uint)fVar53);
          pIVar31->FontWindowScale = fVar53;
          if (pIVar31 == pIVar31->RootWindow) {
            fVar53 = fVar53 / IVar50.x;
            IVar49 = pIVar31->Size;
            auVar57._8_8_ = 0;
            auVar57._0_4_ = IVar49.x;
            auVar57._4_4_ = IVar49.y;
            IVar54 = (pIVar44->IO).MousePos;
            IVar50.x = (pIVar31->Pos).x;
            fVar58 = (pIVar31->Pos).y;
            auVar60._0_4_ = (IVar54.x - IVar50.x) * (1.0 - fVar53) * IVar49.x;
            auVar60._4_4_ = (IVar54.y - fVar58) * (1.0 - fVar53) * IVar49.y;
            auVar60._8_8_ = 0;
            auVar59 = divps(auVar60,auVar57);
            local_88._4_4_ = auVar59._4_4_ + fVar58;
            local_88._0_4_ = auVar59._0_4_ + IVar50.x;
            IStack_80 = IVar62.Max;
            SetWindowPos(pIVar31,(ImVec2 *)local_88,0);
            IVar50 = pIVar31->SizeFull;
            IVar51.x = (float)(int)((pIVar31->Size).x * fVar53);
            IVar51.y = (float)(int)((pIVar31->Size).y * fVar53);
            pIVar31->Size = IVar51;
            (pIVar31->SizeFull).x = (float)(int)(IVar50.x * fVar53);
            (pIVar31->SizeFull).y = (float)(int)(IVar50.y * fVar53);
          }
        }
        goto LAB_00110015;
      }
    }
    else if ((bVar22 & 1U) != 0) goto LAB_00110015;
    if (((pIVar44->IO).KeyShift != true) ||
       (local_b8._0_4_ = IVar50.x, (pIVar44->IO).ConfigMacOSXBehaviors == true)) {
      local_b8._0_4_ = (pIVar44->IO).MouseWheelH;
      if ((IVar50.x != 0.0) || (NAN(IVar50.x))) {
        StartLockWheelingWindow(pIVar31);
        while ((uVar46 = pIVar31->Flags, (uVar46 >> 0x18 & 1) != 0 &&
               (((uVar46 & 0x210) == 0x10 ||
                ((fVar53 = (pIVar31->ScrollMax).y, fVar53 == 0.0 && (!NAN(fVar53)))))))) {
          pIVar31 = pIVar31->ParentWindow;
        }
        if ((uVar46 & 0x210) == 0) {
          fVar58 = ((pIVar31->InnerRect).Max.y - (pIVar31->InnerRect).Min.y) * 0.67;
          fVar48 = ImGuiWindow::CalcFontSize(pIVar31);
          fVar53 = fVar48 * 5.0;
          if (fVar58 <= fVar48 * 5.0) {
            fVar53 = fVar58;
          }
          (pIVar31->ScrollTarget).y = (pIVar31->Scroll).y - IVar50.x * (float)(int)fVar53;
          (pIVar31->ScrollTargetCenterRatio).y = 0.0;
          (pIVar31->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
    }
    if (((float)local_b8._0_4_ != 0.0) || (NAN((float)local_b8._0_4_))) {
      StartLockWheelingWindow(pIVar31);
      while ((uVar46 = pIVar31->Flags, (uVar46 >> 0x18 & 1) != 0 &&
             (((uVar46 & 0x210) == 0x10 ||
              ((IVar50.x = (pIVar31->ScrollMax).x, IVar50.x == 0.0 && (!NAN(IVar50.x)))))))) {
        pIVar31 = pIVar31->ParentWindow;
      }
      if ((uVar46 & 0x210) == 0) {
        fVar53 = ((pIVar31->InnerRect).Max.x - (pIVar31->InnerRect).Min.x) * 0.67;
        fVar58 = ImGuiWindow::CalcFontSize(pIVar31);
        IVar50.x = fVar58 + fVar58;
        if (fVar53 <= fVar58 + fVar58) {
          IVar50.x = fVar53;
        }
        (pIVar31->ScrollTarget).x =
             (pIVar31->Scroll).x - (float)local_b8._0_4_ * (float)(int)IVar50.x;
        (pIVar31->ScrollTargetCenterRatio).x = 0.0;
        (pIVar31->ScrollTargetEdgeSnapDist).x = 0.0;
      }
    }
  }
LAB_00110015:
  local_b8._0_4_ = 3.4028235e+38;
  if ((ctx->GcCompactAll == false) &&
     (IVar50.x = (ctx->IO).ConfigMemoryCompactTimer, 0.0 <= IVar50.x)) {
    local_b8._0_4_ = (float)ctx->Time - IVar50.x;
  }
  for (uVar38 = 0; uVar38 != (uint)(ctx->Windows).Size; uVar38 = uVar38 + 1) {
    pIVar31 = (ctx->Windows).Data[uVar38];
    bVar22 = pIVar31->Active;
    pIVar31->WasActive = bVar22;
    pIVar31->BeginCount = 0;
    pIVar31->Active = false;
    pIVar31->WriteAccessed = false;
    if (((bVar22 == false) && (pIVar31->MemoryCompacted == false)) &&
       (pIVar31->LastTimeActive <= (float)local_b8._0_4_ &&
        (float)local_b8._0_4_ != pIVar31->LastTimeActive)) {
      GcCompactTransientWindowBuffers(pIVar31);
    }
  }
  lVar43 = 0;
  for (lVar37 = 0; lVar37 < (ctx->TablesLastTimeActive).Size; lVar37 = lVar37 + 1) {
    IVar50.x = (ctx->TablesLastTimeActive).Data[lVar37];
    if ((0.0 <= IVar50.x) && (IVar50.x < (float)local_b8._0_4_)) {
      TableGcCompactTransientBuffers((ImGuiTable *)((long)&((ctx->Tables).Buf.Data)->ID + lVar43));
    }
    lVar43 = lVar43 + 0x208;
  }
  lVar43 = 0;
  for (lVar37 = 0; lVar37 < (ctx->TablesTempData).Size; lVar37 = lVar37 + 1) {
    pIVar12 = (ctx->TablesTempData).Data;
    IVar50.x = *(float *)((long)&pIVar12->LastTimeActive + lVar43);
    if ((0.0 <= IVar50.x) && (IVar50.x < (float)local_b8._0_4_)) {
      TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar12->TableIndex + lVar43));
    }
    lVar43 = lVar43 + 0x70;
  }
  if (ctx->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  ctx->GcCompactAll = false;
  if ((ctx->NavWindow != (ImGuiWindow *)0x0) && (ctx->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindowStackData>::resize(&ctx->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&ctx->BeginPopupStack,0);
  ImVector<int>::resize(&ctx->ItemFlagsStack,0);
  auVar18._12_4_ = 0;
  auVar18._0_12_ = stack0xffffffffffffff7c;
  _local_88 = (ImRect)(auVar18 << 0x20);
  ImVector<int>::push_back(&ctx->ItemFlagsStack,(int *)local_88);
  ImVector<ImGuiGroupData>::resize(&ctx->GroupStack,0);
  pIVar44 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar44->DebugItemPickerActive == true) {
    uVar46 = pIVar44->HoveredIdPreviousFrame;
    pIVar44->MouseCursor = 7;
    bVar22 = IsKeyPressed(0x20e,true);
    if (bVar22) {
      pIVar44->DebugItemPickerActive = false;
    }
    if (uVar46 != 0 && (pIVar44->IO).MouseDownDuration[0] == 0.0) {
      pIVar44->DebugItemPickerBreakId = uVar46;
      pIVar44->DebugItemPickerActive = false;
    }
    *(byte *)&(pIVar44->NextWindowData).Flags = (byte)(pIVar44->NextWindowData).Flags | 0x40;
    (pIVar44->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar46);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar46 == 0),"Click to break in debugger!");
    End();
    pIVar44 = GImGui;
  }
  pIVar44->DebugHookIdInfo = 0;
  if (pIVar44->FrameCount == (pIVar44->DebugStackTool).LastActiveFrame + 1) {
    IVar35 = pIVar44->HoveredIdPreviousFrame;
    if (IVar35 == 0) {
      IVar35 = pIVar44->ActiveId;
    }
    if ((pIVar44->DebugStackTool).QueryId != IVar35) {
      (pIVar44->DebugStackTool).QueryId = IVar35;
      (pIVar44->DebugStackTool).StackLevel = -1;
      ImVector<ImGuiStackLevelInfo>::resize(&(pIVar44->DebugStackTool).Results,0);
    }
    if (IVar35 != 0) {
      uVar46 = (pIVar44->DebugStackTool).StackLevel;
      lVar43 = (long)(int)uVar46;
      if (lVar43 < 0) {
        if (uVar46 == 0xffffffff) {
          pIVar44->DebugHookIdInfo = IVar35;
        }
      }
      else {
        iVar34 = (pIVar44->DebugStackTool).Results.Size;
        if ((int)uVar46 < iVar34) {
          pIVar13 = (pIVar44->DebugStackTool).Results.Data;
          if ((pIVar13[lVar43].QuerySuccess != false) || ('\x02' < pIVar13[lVar43].QueryFrameCount))
          {
            uVar46 = uVar46 + 1;
            (pIVar44->DebugStackTool).StackLevel = uVar46;
          }
        }
        if ((int)uVar46 < iVar34) {
          pIVar13 = (pIVar44->DebugStackTool).Results.Data;
          pIVar44->DebugHookIdInfo = pIVar13[uVar46].ID;
          pIVar1 = &pIVar13[uVar46].QueryFrameCount;
          *pIVar1 = *pIVar1 + '\x01';
        }
      }
    }
  }
  ctx->WithinFrameScopeWithImplicitWindow = true;
  pIVar44 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar44->NextWindowData).SizeVal.x = 400.0;
  (pIVar44->NextWindowData).SizeVal.y = 400.0;
  (pIVar44->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  CallContextHooks(ctx,ImGuiContextHookType_NewFramePost);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask.ClearAllBits();
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}